

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transaction.cpp
# Opt level: O0

ssize_t __thiscall Transaction::write(Transaction *this,int __fd,void *__buf,size_t __n)

{
  reference pvVar1;
  int local_14;
  int value_local;
  int data_item_local;
  Transaction *this_local;
  
  local_14 = __fd;
  _value_local = this;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->local_write_store,(long)__fd);
  *pvVar1 = (value_type)__buf;
  std::set<int,_std::less<int>,_std::allocator<int>_>::insert(&this->writeSet,&local_14);
  return 0;
}

Assistant:

int Transaction::write(const int data_item, int value) {
    local_write_store[data_item] = value;
    writeSet.insert(data_item);
    return 0;

}